

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::EscapeForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *str,bool makeVars,
          bool forEcho,bool useWatcomQuote)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  cmState *pcVar6;
  long lVar7;
  uint flags;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1be;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1bd;
  allocator<char> local_1bc;
  allocator<char> local_1bb;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  allocator<char> local_1b8;
  allocator<char> local_1b7;
  allocator<char> local_1b6;
  allocator<char> local_1b5;
  allocator<char> local_1b4;
  allocator<char> local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if (cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::shellOperators_abi_cxx11_ ==
      '\0') {
    iVar4 = __cxa_guard_acquire(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                                 shellOperators_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"<",&local_1b1);
      std::__cxx11::string::string<std::allocator<char>>(local_190,">",&local_1b2);
      std::__cxx11::string::string<std::allocator<char>>(local_170,"<<",&local_1b3);
      std::__cxx11::string::string<std::allocator<char>>(local_150,">>",&local_1b4);
      std::__cxx11::string::string<std::allocator<char>>(local_130,"|",&local_1b5);
      std::__cxx11::string::string<std::allocator<char>>(local_110,"||",&local_1b6);
      std::__cxx11::string::string<std::allocator<char>>(local_f0,"&&",&local_1b7);
      std::__cxx11::string::string<std::allocator<char>>(local_d0,"&>",&local_1b8);
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"1>",&local_1b9);
      std::__cxx11::string::string<std::allocator<char>>(local_90,"2>",&local_1ba);
      std::__cxx11::string::string<std::allocator<char>>(local_70,"2>&1",&local_1bb);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"1>&2",&local_1bc);
      __l._M_len = 0xc;
      __l._M_array = &local_1b0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
               shellOperators_abi_cxx11_,__l,&local_1bd,&local_1be);
      lVar7 = 0x160;
      do {
        std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                          shellOperators_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                           shellOperators_abi_cxx11_);
    }
  }
  sVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)cmOutputConverterIsShellOperator(std::__cxx11::string_const&)::
                     shellOperators_abi_cxx11_,str);
  if (sVar5 == 0) {
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsVSIDE(pcVar6);
    uVar3 = 2;
    if (!bVar2) {
      uVar3 = this->LinkScriptShell ^ 1;
    }
    flags = uVar3 | 0x40;
    if (!makeVars) {
      flags = uVar3;
    }
    uVar3 = flags | 4;
    if (!forEcho) {
      uVar3 = flags;
    }
    uVar1 = uVar3 | 0x80;
    if (!useWatcomQuote) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWatcomWMake(pcVar6);
    uVar3 = uVar1 | 8;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseMinGWMake(pcVar6);
    uVar1 = uVar3 | 0x10;
    if (!bVar2) {
      uVar1 = uVar3;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseNMake(pcVar6);
    uVar3 = uVar1 | 0x20;
    if (!bVar2) {
      uVar3 = uVar1;
    }
    pcVar6 = cmStateSnapshot::GetState(&this->StateSnapshot);
    bVar2 = cmState::UseWindowsShell(pcVar6);
    uVar1 = uVar3 | 0x100;
    if (bVar2) {
      uVar1 = uVar3;
    }
    Shell__GetArgument_abi_cxx11_
              (__return_storage_ptr__,(cmOutputConverter *)(str->_M_dataplus)._M_p,
               (char *)(ulong)uVar1,flags);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(const std::string& str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote) const
{
  // Do not escape shell operators.
  if (cmOutputConverterIsShellOperator(str)) {
    return str;
  }

  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return Shell__GetArgument(str.c_str(), flags);
}